

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::ListOp<tinyusdz::Reference>::ClearAndMakeExplicit(ListOp<tinyusdz::Reference> *this)

{
  Reference *pRVar1;
  Reference *pRVar2;
  
  pRVar1 = (this->explicit_items).
           super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (this->explicit_items).
           super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar2 != pRVar1) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Reference*>(pRVar1,pRVar2);
    (this->explicit_items).
    super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar1;
  }
  pRVar1 = (this->added_items).
           super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (this->added_items).
           super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar2 != pRVar1) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Reference*>(pRVar1,pRVar2);
    (this->added_items).
    super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar1;
  }
  pRVar1 = (this->prepended_items).
           super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (this->prepended_items).
           super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar2 != pRVar1) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Reference*>(pRVar1,pRVar2);
    (this->prepended_items).
    super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar1;
  }
  pRVar1 = (this->appended_items).
           super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (this->appended_items).
           super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar2 != pRVar1) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Reference*>(pRVar1,pRVar2);
    (this->appended_items).
    super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar1;
  }
  pRVar1 = (this->deleted_items).
           super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (this->deleted_items).
           super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar2 != pRVar1) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Reference*>(pRVar1,pRVar2);
    (this->deleted_items).
    super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar1;
  }
  pRVar1 = (this->ordered_items).
           super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (this->ordered_items).
           super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar2 != pRVar1) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Reference*>(pRVar1,pRVar2);
    (this->ordered_items).
    super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar1;
  }
  this->is_explicit = true;
  return;
}

Assistant:

void ClearAndMakeExplicit() {
    explicit_items.clear();
    added_items.clear();
    prepended_items.clear();
    appended_items.clear();
    deleted_items.clear();
    ordered_items.clear();

    is_explicit = true;
  }